

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_is_strict_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint64_t uVar1;
  uint64_t uVar2;
  roaring_bitmap_t *in_RSI;
  roaring_bitmap_t *in_stack_00000010;
  undefined1 local_11;
  
  uVar1 = roaring_bitmap_get_cardinality(in_RSI);
  uVar2 = roaring_bitmap_get_cardinality(in_RSI);
  local_11 = false;
  if (uVar2 < uVar1) {
    local_11 = roaring_bitmap_is_subset(r2,in_stack_00000010);
  }
  return local_11;
}

Assistant:

bool roaring_bitmap_is_strict_subset(const roaring_bitmap_t *r1,
                                     const roaring_bitmap_t *r2) {
    return (roaring_bitmap_get_cardinality(r2) >
                roaring_bitmap_get_cardinality(r1) &&
            roaring_bitmap_is_subset(r1, r2));
}